

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O1

GlContext * sf::priv::GlContext::create(void)

{
  GlxContext *this;
  Lock lock;
  Lock local_40;
  ContextSettings local_38;
  
  Lock::Lock(&local_40,(Mutex *)&(anonymous_namespace)::GlContextImpl::mutex);
  setActive(&(anonymous_namespace)::GlContextImpl::sharedContext->super_GlContext,true);
  this = (GlxContext *)operator_new(0x58);
  GlxContext::GlxContext(this,(anonymous_namespace)::GlContextImpl::sharedContext);
  setActive(&(anonymous_namespace)::GlContextImpl::sharedContext->super_GlContext,false);
  local_38.depthBits = 0;
  local_38.stencilBits = 0;
  local_38.antialiasingLevel = 0;
  local_38.majorVersion = 1;
  local_38.minorVersion = 1;
  local_38.attributeFlags = 0;
  local_38.sRgbCapable = false;
  initialize((GlContext *)this,&local_38);
  Lock::~Lock(&local_40);
  return &this->super_GlContext;
}

Assistant:

GlContext* GlContext::create()
{
    using GlContextImpl::mutex;
    using GlContextImpl::sharedContext;

    // Make sure that there's an active context (context creation may need extensions, and thus a valid context)
    assert(sharedContext != NULL);

    Lock lock(mutex);

    GlContext* context = NULL;

    // We don't use acquireTransientContext here since we have
    // to ensure we have exclusive access to the shared context
    // in order to make sure it is not active during context creation
    {
        sharedContext->setActive(true);

        // Create the context
        context = new ContextType(sharedContext);

        sharedContext->setActive(false);
    }

    context->initialize(ContextSettings());

    return context;
}